

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::ReadMaterialSurface
          (ColladaExporter *this,Surface *poSurface,aiMaterial *pSrcMat,aiTextureType pTexture,
          char *pKey,size_t pType,size_t pIndex)

{
  aiString *this_00;
  bool bVar1;
  uint uVar2;
  aiReturn aVar3;
  char *pcVar4;
  long lVar5;
  uint64_t uVar6;
  pointer ppVar7;
  DeadlyImportError *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  iterator local_4e8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  iterator local_4d8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  const_iterator name;
  exception *error;
  key_type local_478 [2];
  uint index;
  allocator<char> local_461;
  undefined1 local_460 [8];
  string index_str;
  uint uvChannel;
  aiString texfile;
  size_t pType_local;
  char *pKey_local;
  aiTextureType pTexture_local;
  aiMaterial *pSrcMat_local;
  Surface *poSurface_local;
  ColladaExporter *this_local;
  
  uVar2 = aiMaterial::GetTextureCount(pSrcMat,pTexture);
  if (uVar2 == 0) {
    if (pKey != (char *)0x0) {
      aVar3 = aiMaterial::Get(pSrcMat,pKey,(uint)pType,(uint)pIndex,&poSurface->color);
      poSurface->exist = aVar3 == aiReturn_SUCCESS;
    }
  }
  else {
    this_00 = (aiString *)((long)&index_str.field_2._M_allocated_capacity + 0xc);
    aiString::aiString(this_00);
    index_str.field_2._8_4_ = 0;
    aiMaterial::GetTexture
              (pSrcMat,pTexture,0,this_00,(aiTextureMapping *)0x0,
               (uint *)(index_str.field_2._M_local_buf + 8),(ai_real *)0x0,(aiTextureOp *)0x0,
               (aiTextureMapMode *)0x0);
    pcVar4 = aiString::C_Str(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_460,pcVar4,&local_461);
    std::allocator<char>::~allocator(&local_461);
    lVar5 = std::__cxx11::string::size();
    if ((lVar5 == 0) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_460), *pcVar4 != '*')) {
      pcVar4 = aiString::C_Str((aiString *)((long)&index_str.field_2 + 0xc));
      std::__cxx11::string::operator=((string *)&poSurface->texture,pcVar4);
    }
    else {
      std::__cxx11::string::substr((ulong)&error,(ulong)local_460);
      std::__cxx11::string::operator=((string *)local_460,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      uVar6 = strtoul10_64(pcVar4,(char **)0x0,(uint *)0x0);
      local_478[0] = (key_type)uVar6;
      local_4d8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->textures,local_478);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_4d0,&local_4d8);
      local_4e8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->textures);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_4e0,&local_4e8);
      bVar1 = std::operator!=(&local_4d0,&local_4e0);
      if (!bVar1) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_508,"could not find embedded texture at index ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460);
        DeadlyImportError::DeadlyImportError(this_01,&local_508);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_4d0);
      std::__cxx11::string::operator=((string *)&poSurface->texture,(string *)&ppVar7->second);
    }
    poSurface->channel = (ulong)(uint)index_str.field_2._8_4_;
    poSurface->exist = true;
    std::__cxx11::string::~string((string *)local_460);
  }
  return;
}

Assistant:

void ColladaExporter::ReadMaterialSurface( Surface& poSurface, const aiMaterial* pSrcMat, 
                                          aiTextureType pTexture, const char* pKey, size_t pType, size_t pIndex) {
  if( pSrcMat->GetTextureCount( pTexture) > 0 ) {
    aiString texfile;
    unsigned int uvChannel = 0;
    pSrcMat->GetTexture( pTexture, 0, &texfile, NULL, &uvChannel);

    std::string index_str(texfile.C_Str());

    if(index_str.size() != 0 && index_str[0] == '*') {
        unsigned int index;

        index_str = index_str.substr(1, std::string::npos);

        try {
            index = (unsigned int) strtoul10_64(index_str.c_str());
        } catch(std::exception& error) {
            throw DeadlyExportError(error.what());
        }

        std::map<unsigned int, std::string>::const_iterator name = textures.find(index);

        if(name != textures.end()) {
            poSurface.texture = name->second;
        } else {
            throw DeadlyExportError("could not find embedded texture at index " + index_str);
        }
    } else {
        poSurface.texture = texfile.C_Str();
    }

    poSurface.channel = uvChannel;
    poSurface.exist = true;
  } else {
    if( pKey )
      poSurface.exist = pSrcMat->Get( pKey, static_cast<unsigned int>(pType), static_cast<unsigned int>(pIndex), poSurface.color) == aiReturn_SUCCESS;
  }
}